

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::SimpleDescriptorDatabaseExtraTest_FindAllFileNames_Test::
~SimpleDescriptorDatabaseExtraTest_FindAllFileNames_Test
          (SimpleDescriptorDatabaseExtraTest_FindAllFileNames_Test *this)

{
  SimpleDescriptorDatabaseExtraTest_FindAllFileNames_Test *this_local;
  
  ~SimpleDescriptorDatabaseExtraTest_FindAllFileNames_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SimpleDescriptorDatabaseExtraTest, FindAllFileNames) {
  FileDescriptorProto f;
  f.set_name("foo.proto");
  f.set_package("foo");
  f.add_message_type()->set_name("Foo");

  SimpleDescriptorDatabase db;
  db.Add(f);

  // Test!
  std::vector<std::string> all_files;
  db.FindAllFileNames(&all_files);
  EXPECT_THAT(all_files, testing::ElementsAre("foo.proto"));
}